

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

void http_CalcResponseVersion
               (int request_major_vers,int request_minor_vers,int *response_major_vers,
               int *response_minor_vers)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 1;
  iVar2 = iVar1;
  if (request_major_vers < 1) {
    iVar2 = request_major_vers;
  }
  iVar3 = request_minor_vers;
  if (0 < request_minor_vers) {
    iVar3 = iVar1;
  }
  if (request_major_vers != 1) {
    iVar3 = request_minor_vers;
  }
  if (1 < request_major_vers) {
    iVar3 = iVar1;
  }
  *response_major_vers = iVar2;
  *response_minor_vers = iVar3;
  return;
}

Assistant:

void http_CalcResponseVersion(int request_major_vers,
	int request_minor_vers,
	int *response_major_vers,
	int *response_minor_vers)
{
	if ((request_major_vers > 1) ||
		(request_major_vers == 1 && request_minor_vers >= 1)) {
		*response_major_vers = 1;
		*response_minor_vers = 1;
	} else {
		*response_major_vers = request_major_vers;
		*response_minor_vers = request_minor_vers;
	}
}